

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

void AI::pruneOldEngramsImpl
               (vector<AI::Engram,_std::allocator<AI::Engram>_> *engrams,int *focus,
               bool maintainOrder)

{
  pointer __src;
  pointer *ppEVar1;
  StimulusType *pSVar2;
  long lVar3;
  undefined8 uVar4;
  Actor *pAVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  iterator iVar12;
  int iVar13;
  pointer pEVar14;
  ulong uVar15;
  undefined7 in_register_00000011;
  pointer pEVar16;
  int *piVar17;
  int iVar18;
  int iVar19;
  pointer pEVar20;
  vector<int,_std::allocator<int>_> oldIds;
  int i;
  int *local_78;
  iterator iStack_70;
  int *local_68;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  Actor *pAStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if ((int)CONCAT71(in_register_00000011,maintainOrder) == 0) {
    local_78 = (int *)0x0;
    iStack_70._M_current = (int *)0x0;
    local_68 = (int *)0x0;
    local_58 = local_58 & 0xffffffff00000000;
    iVar18 = (int)((ulong)((long)(engrams->
                                 super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(engrams->
                                super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl
                                .super__Vector_impl_data._M_start) >> 4);
    iVar19 = iVar18 * -0x55555555;
    if (0 < iVar19) {
      iVar13 = 0;
      do {
        if ((300 < (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar13].age) && (*focus != iVar13)) {
          if (iStack_70._M_current == local_68) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_78,iStack_70,(int *)&local_58);
          }
          else {
            *iStack_70._M_current = iVar13;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
        iVar12._M_current = iStack_70._M_current;
        piVar17 = local_78;
        iVar13 = (int)local_58 + 1;
        local_58 = CONCAT44(local_58._4_4_,iVar13);
      } while (SBORROW4(iVar13,iVar19) != iVar13 + iVar18 * 0x55555555 < 0);
      if (local_78 != iStack_70._M_current) {
        uVar15 = (long)iStack_70._M_current - (long)local_78 >> 2;
        lVar3 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                  (local_78,iStack_70._M_current,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                  (piVar17,iVar12._M_current);
      }
    }
    if (local_78 != iStack_70._M_current) {
      iVar18 = *focus;
      piVar17 = local_78;
      do {
        iVar19 = *piVar17;
        pEVar16 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pEVar20 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        pEVar14 = pEVar16 + iVar19;
        local_58._0_4_ = (int)(pEVar14->stimulus).x;
        local_58._4_4_ = (pEVar14->stimulus).y;
        uStack_50 = *(undefined8 *)&(pEVar14->stimulus).intensity;
        local_48 = *(undefined8 *)&pEVar16[iVar19].stimulus.field_3;
        pAStack_40 = pEVar16[iVar19].stimulus.field_3.visual.target;
        pSVar2 = &pEVar16[iVar19].stimulus.type;
        local_38 = *(undefined8 *)pSVar2;
        uStack_30 = *(undefined8 *)(pSVar2 + 2);
        fVar8 = pEVar20[-1].stimulus.x;
        fVar9 = pEVar20[-1].stimulus.y;
        fVar10 = pEVar20[-1].stimulus.intensity;
        uVar11 = *(undefined4 *)&pEVar20[-1].stimulus.field_0xc;
        uVar4 = *(undefined8 *)&pEVar20[-1].stimulus.field_3;
        pAVar5 = pEVar20[-1].stimulus.field_3.visual.target;
        uVar7 = *(undefined4 *)&pEVar20[-1].stimulus.field_0x24;
        uVar6 = *(undefined8 *)&pEVar20[-1].type;
        pEVar14 = pEVar16 + iVar19;
        (pEVar14->stimulus).type = pEVar20[-1].stimulus.type;
        *(undefined4 *)&(pEVar14->stimulus).field_0x24 = uVar7;
        *(undefined8 *)(&(pEVar14->stimulus).type + 2) = uVar6;
        *(undefined8 *)&pEVar16[iVar19].stimulus.field_3 = uVar4;
        pEVar16[iVar19].stimulus.field_3.visual.target = pAVar5;
        pEVar16 = pEVar16 + iVar19;
        (pEVar16->stimulus).x = fVar8;
        (pEVar16->stimulus).y = fVar9;
        (pEVar16->stimulus).intensity = fVar10;
        *(undefined4 *)&(pEVar16->stimulus).field_0xc = uVar11;
        *(undefined8 *)&pEVar20[-1].stimulus.type = local_38;
        pEVar20[-1].type = (int)uStack_30;
        pEVar20[-1].age = (int)((ulong)uStack_30 >> 0x20);
        *(undefined8 *)&pEVar20[-1].stimulus.field_3 = local_48;
        pEVar20[-1].stimulus.field_3.visual.target = pAStack_40;
        pEVar20[-1].stimulus.x = (float)(int)local_58;
        pEVar20[-1].stimulus.y = (float)local_58._4_4_;
        *(undefined8 *)&pEVar20[-1].stimulus.intensity = uStack_50;
        ppEVar1 = &(engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + -1;
        if (iVar19 < iVar18) {
          *focus = *focus + -1;
        }
        piVar17 = piVar17 + 1;
      } while (piVar17 != iStack_70._M_current);
    }
    if (local_78 != (int *)0x0) {
      operator_delete(local_78,(long)local_68 - (long)local_78);
    }
  }
  else {
    pEVar14 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pEVar16 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)pEVar16 - (long)pEVar14) >> 4) * -0x55555555) {
      iVar18 = 0;
      pEVar20 = pEVar14;
      do {
        if (300 < pEVar20[iVar18].age) {
          __src = pEVar20 + iVar18 + 1;
          if (__src != pEVar16) {
            memmove(pEVar20 + iVar18,__src,(long)pEVar16 - (long)__src);
            pEVar14 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            pEVar16 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          }
          pEVar16 = pEVar16 + -1;
          (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
          super__Vector_impl_data._M_finish = pEVar16;
          iVar18 = iVar18 + -1;
          pEVar20 = pEVar14;
        }
        iVar18 = iVar18 + 1;
        iVar19 = (int)((ulong)((long)pEVar16 - (long)pEVar20) >> 4);
      } while (SBORROW4(iVar18,iVar19 * -0x55555555) != iVar18 + iVar19 * 0x55555555 < 0);
    }
  }
  return;
}

Assistant:

void pruneOldEngramsImpl(std::vector<Engram>& engrams, int& focus, bool maintainOrder)
	{
		//A locus' engrams are sensitive to their order, so use a slower method to handle that case
		if (maintainOrder)
		{
			for (int i = 0; i < static_cast<int>(engrams.size()); i++)
			{
				if (engrams[i].age > MaxEngramAge)
				{
					engrams.erase(begin(engrams) + i);
					i--;
				}
			}
		}
		else
		{
			/*
			Order doesn't matter, so we can swap soon-to-be-removed engrams with the
			last engram to do a more efficient pop_back
			*/
			std::vector<int> oldIds;
			for(int i = 0, size = engrams.size(); i < size; i++)
			{
				if (engrams[i].age > MaxEngramAge
					&& focus != i)
				{
					oldIds.push_back(i);
				}
			}

			std::sort(begin(oldIds), end(oldIds), std::greater<int>());

			auto oldFocus = focus;
			int i = 0;
			for(auto id : oldIds)
			{
				std::swap(engrams[id], engrams.back());
				engrams.pop_back();
			
				if (id < oldFocus)
					focus--;

				i++;
			}
		}
		
	}